

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Config_inl.hpp
# Opt level: O0

vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> * __thiscall
CLI::ConfigBase::from_config
          (vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *__return_storage_ptr__,
          ConfigBase *this,istream *input)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar1;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  __type _Var5;
  byte bVar6;
  int iVar7;
  istream *piVar8;
  char *pcVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  size_t sVar13;
  reference pvVar14;
  pointer pCVar15;
  pointer pCVar16;
  iterator __first;
  iterator __last;
  reference pvVar17;
  size_type sVar18;
  bool bVar19;
  bool bVar20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_8c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_868;
  bool local_841;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_808;
  bool local_795;
  char local_715;
  char local_714;
  char local_713;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_6e8;
  undefined1 local_6d0 [8];
  string ename;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_698;
  const_iterator local_690;
  __normal_iterator<CLI::ConfigItem_*,_std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>_>
  local_688;
  __normal_iterator<CLI::ConfigItem_*,_std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>_>
  local_680;
  iterator match;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_670;
  const_iterator local_668;
  invalid_argument *ia;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *it;
  iterator __end3;
  iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  undefined1 local_5f8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parents;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5d0;
  iterator local_5b0;
  size_type local_5a8;
  string local_5a0;
  string local_580;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_560;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_558;
  iterator local_538;
  size_type local_530;
  string local_528;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_508;
  string local_4f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4d0;
  string local_4b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_498;
  string local_480;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_460;
  undefined1 local_448 [8];
  string multiline;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_420;
  iterator local_400;
  size_type local_3f8;
  invalid_argument *iarg_1;
  undefined1 local_3a0 [8];
  string l2;
  invalid_argument *iarg;
  byte local_32a;
  byte local_329;
  string local_328 [6];
  bool firstLine;
  bool lineExtension;
  char local_301;
  undefined1 local_300 [7];
  value_type keyChar;
  string local_2e0;
  undefined1 local_2c0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  citems;
  undefined1 local_2a0 [7];
  bool mlquote;
  undefined1 local_280 [8];
  string item;
  string local_240;
  ulong local_220;
  size_type comment_pos;
  size_type delimiter_pos;
  ulong uStack_208;
  value_type test_char;
  size_t search_start;
  string local_1e0;
  string local_1c0 [32];
  string local_1a0 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_180;
  char local_165;
  int local_164;
  value_type cchar;
  ulong uStack_160;
  size_t len;
  undefined1 local_138 [8];
  string name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  items_buffer;
  string local_e8 [8];
  string line_sep_chars;
  int currentSectionIndex;
  char aSep;
  char aEnd;
  char aStart;
  bool inMLineValue;
  bool inMLineComment;
  bool inSection;
  bool isINIArray;
  bool isDefaultArray;
  string previousSection;
  allocator local_81;
  undefined1 local_80 [8];
  string currentSection;
  string buffer;
  string line;
  istream *input_local;
  ConfigBase *this_local;
  vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *output;
  
  ::std::__cxx11::string::string((string *)(buffer.field_2._M_local_buf + 8));
  ::std::__cxx11::string::string((string *)(currentSection.field_2._M_local_buf + 8));
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)local_80,"default",&local_81);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_81);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&aStart,"default",(allocator *)&aEnd);
  ::std::allocator<char>::~allocator((allocator<char> *)&aEnd);
  std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::vector(__return_storage_ptr__);
  bVar19 = false;
  if ((this->arrayStart == '[') && (bVar19 = false, this->arrayEnd == ']')) {
    bVar19 = this->arraySeparator == ',';
  }
  if ((this->arrayStart == '\0') || (bVar20 = false, this->arrayStart == ' ')) {
    bVar20 = this->arrayStart == this->arrayEnd;
  }
  bVar4 = false;
  if (bVar20) {
    local_713 = '[';
    local_714 = ']';
  }
  else {
    local_713 = this->arrayStart;
    local_714 = this->arrayEnd;
  }
  line_sep_chars.field_2._M_local_buf[0xf] = local_714;
  if ((bVar20) && (this->arraySeparator == ' ')) {
    local_715 = ',';
  }
  else {
    local_715 = this->arraySeparator;
  }
  line_sep_chars.field_2._M_local_buf[0xe] = local_715;
  line_sep_chars.field_2._8_4_ = 0;
  items_buffer.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._5_1_ = this->parentSeparatorChar;
  items_buffer.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = this->commentChar;
  items_buffer.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = this->valueDelimiter;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string
            (local_e8,(undefined1 *)
                      ((long)&items_buffer.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage + 5),3,
             (undefined1 *)
             ((long)&items_buffer.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  ::std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&items_buffer.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  do {
    piVar8 = ::std::getline<char,std::char_traits<char>,std::allocator<char>>
                       (input,(string *)(currentSection.field_2._M_local_buf + 8));
    bVar2 = ::std::ios::operator_cast_to_bool((ios *)(piVar8 + *(long *)(*(long *)piVar8 + -0x18)));
    if (!bVar2) {
      bVar19 = ::std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_80,"default");
      if (bVar19) {
        ::std::__cxx11::string::string((string *)local_6d0);
        std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::emplace_back<>
                  (__return_storage_ptr__);
        detail::generate_parents
                  (&local_6e8,(string *)local_80,(string *)local_6d0,this->parentSeparatorChar);
        pvVar17 = std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::back
                            (__return_storage_ptr__);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=(&pvVar17->parents,&local_6e8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_6e8);
        pvVar17 = std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::back
                            (__return_storage_ptr__);
        ::std::__cxx11::string::operator=((string *)&pvVar17->name,"--");
        while( true ) {
          pvVar17 = std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::back
                              (__return_storage_ptr__);
          sVar18 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::size(&pvVar17->parents);
          if (sVar18 < 2) break;
          pvVar17 = std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::back
                              (__return_storage_ptr__);
          std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::push_back
                    (__return_storage_ptr__,pvVar17);
          pvVar17 = std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::back
                              (__return_storage_ptr__);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::pop_back(&pvVar17->parents);
        }
        ::std::__cxx11::string::~string((string *)local_6d0);
      }
      local_164 = 1;
      ::std::__cxx11::string::~string(local_e8);
      ::std::__cxx11::string::~string((string *)&aStart);
      ::std::__cxx11::string::~string((string *)local_80);
      ::std::__cxx11::string::~string((string *)(currentSection.field_2._M_local_buf + 8));
      ::std::__cxx11::string::~string((string *)(buffer.field_2._M_local_buf + 8));
      return __return_storage_ptr__;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&name.field_2 + 8));
    ::std::__cxx11::string::string((string *)local_138);
    detail::trim_copy((string *)&len,(string *)((long)&currentSection.field_2 + 8));
    ::std::__cxx11::string::operator=((string *)(buffer.field_2._M_local_buf + 8),(string *)&len);
    ::std::__cxx11::string::~string((string *)&len);
    uStack_160 = ::std::__cxx11::string::length();
    if (uStack_160 < 3) {
      local_164 = 2;
    }
    else {
      iVar7 = ::std::__cxx11::string::compare((ulong)((long)&buffer.field_2 + 8),0,(char *)0x3);
      if ((iVar7 == 0) ||
         (iVar7 = ::std::__cxx11::string::compare((ulong)((long)&buffer.field_2 + 8),0,(char *)0x3),
         iVar7 == 0)) {
        bVar2 = true;
        pcVar9 = (char *)::std::__cxx11::string::front();
        local_165 = *pcVar9;
        while (bVar2) {
          piVar8 = ::std::getline<char,std::char_traits<char>,std::allocator<char>>
                             (input,(string *)(buffer.field_2._M_local_buf + 8));
          bVar3 = ::std::ios::operator_cast_to_bool
                            ((ios *)(piVar8 + *(long *)(*(long *)piVar8 + -0x18)));
          if (!bVar3) break;
          detail::trim((string *)((long)&buffer.field_2 + 8));
          bVar3 = detail::hasMLString((string *)((long)&buffer.field_2 + 8),local_165);
          if (bVar3) {
            bVar2 = false;
          }
        }
        local_164 = 2;
      }
      else {
        pcVar9 = (char *)::std::__cxx11::string::front();
        if ((*pcVar9 == '[') && (pcVar9 = (char *)::std::__cxx11::string::back(), *pcVar9 == ']')) {
          bVar4 = ::std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_80,"default");
          if (bVar4) {
            std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::emplace_back<>
                      (__return_storage_ptr__);
            detail::generate_parents
                      (&local_180,(string *)local_80,(string *)local_138,this->parentSeparatorChar);
            pvVar17 = std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::back
                                (__return_storage_ptr__);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator=(&pvVar17->parents,&local_180);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_180);
            pvVar17 = std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::back
                                (__return_storage_ptr__);
            ::std::__cxx11::string::operator=((string *)&pvVar17->name,"--");
          }
          ::std::__cxx11::string::substr((ulong)local_1a0,(ulong)((long)&buffer.field_2 + 8));
          ::std::__cxx11::string::operator=((string *)local_80,local_1a0);
          ::std::__cxx11::string::~string(local_1a0);
          uVar10 = ::std::__cxx11::string::size();
          if (((1 < uVar10) && (pcVar9 = (char *)::std::__cxx11::string::front(), *pcVar9 == '['))
             && (pcVar9 = (char *)::std::__cxx11::string::back(), *pcVar9 == ']')) {
            ::std::__cxx11::string::size();
            ::std::__cxx11::string::substr((ulong)local_1c0,(ulong)local_80);
            ::std::__cxx11::string::operator=((string *)local_80,local_1c0);
            ::std::__cxx11::string::~string(local_1c0);
          }
          ::std::__cxx11::string::string((string *)&search_start,(string *)local_80);
          detail::to_lower(&local_1e0,(string *)&search_start);
          bVar4 = ::std::operator==(&local_1e0,"default");
          ::std::__cxx11::string::~string((string *)&local_1e0);
          ::std::__cxx11::string::~string((string *)&search_start);
          if (bVar4) {
            ::std::__cxx11::string::operator=((string *)local_80,"default");
          }
          else {
            detail::checkParentSegments
                      (__return_storage_ptr__,(string *)local_80,this->parentSeparatorChar);
          }
          bVar4 = false;
          _Var5 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_80,
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&aStart);
          if (_Var5) {
            line_sep_chars.field_2._8_4_ = line_sep_chars.field_2._8_4_ + 1;
          }
          else {
            line_sep_chars.field_2._8_4_ = 0;
            ::std::__cxx11::string::operator=((string *)&aStart,(string *)local_80);
          }
          local_164 = 2;
        }
        else {
          pcVar9 = (char *)::std::__cxx11::string::front();
          if ((*pcVar9 == ';') ||
             ((pcVar9 = (char *)::std::__cxx11::string::front(), *pcVar9 == '#' ||
              (pcVar9 = (char *)::std::__cxx11::string::front(), *pcVar9 == this->commentChar)))) {
            local_164 = 2;
          }
          else {
            uStack_208 = 0;
            lVar11 = ::std::__cxx11::string::find_first_of(buffer.field_2._M_local_buf + 8,0x15c0f5)
            ;
            if (lVar11 != -1) {
              while (uVar10 = uStack_208, uVar12 = ::std::__cxx11::string::size(), uVar10 < uVar12)
              {
                pcVar9 = (char *)::std::__cxx11::string::operator[]
                                           ((ulong)((long)&buffer.field_2 + 8));
                sVar13 = uStack_208;
                delimiter_pos._7_1_ = *pcVar9;
                if (((delimiter_pos._7_1_ == '\"') || (delimiter_pos._7_1_ == '\'')) ||
                   (delimiter_pos._7_1_ == '`')) {
                  pcVar9 = (char *)::std::__cxx11::string::operator[]
                                             ((ulong)((long)&buffer.field_2 + 8));
                  sVar13 = detail::close_sequence
                                     ((string *)((long)&buffer.field_2 + 8),sVar13,*pcVar9);
                  uStack_208 = sVar13 + 1;
                }
                else {
                  if ((delimiter_pos._7_1_ == this->valueDelimiter) ||
                     (delimiter_pos._7_1_ == this->commentChar)) {
                    uStack_208 = uStack_208 - 1;
                    break;
                  }
                  if (((delimiter_pos._7_1_ == ' ') || (delimiter_pos._7_1_ == '\t')) ||
                     (delimiter_pos._7_1_ == this->parentSeparatorChar)) {
                    uStack_208 = uStack_208 + 1;
                  }
                  else {
                    uStack_208 = ::std::__cxx11::string::find_first_of
                                           ((string *)(buffer.field_2._M_local_buf + 8),
                                            (ulong)local_e8);
                  }
                }
              }
            }
            comment_pos = ::std::__cxx11::string::find_first_of
                                    ((char)&buffer + '\x18',(ulong)(uint)(int)this->valueDelimiter);
            local_220 = ::std::__cxx11::string::find_first_of
                                  ((char)&buffer + '\x18',(ulong)(uint)(int)this->commentChar);
            if (local_220 < comment_pos) {
              comment_pos = 0xffffffffffffffff;
            }
            if (comment_pos == 0xffffffffffffffff) {
              ::std::__cxx11::string::substr((ulong)&local_5a0,(ulong)((long)&buffer.field_2 + 8));
              detail::trim_copy(&local_580,&local_5a0);
              ::std::__cxx11::string::operator=((string *)local_138,(string *)&local_580);
              ::std::__cxx11::string::~string((string *)&local_580);
              ::std::__cxx11::string::~string((string *)&local_5a0);
              parents.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string
                        ((string *)&local_5d0,"true",
                         (allocator *)
                         ((long)&parents.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
              parents.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
              local_5b0 = &local_5d0;
              local_5a8 = 1;
              __l._M_len = 1;
              __l._M_array = local_5b0;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)((long)&name.field_2 + 8),__l);
              local_8c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &local_5b0;
              do {
                local_8c0 = local_8c0 + -1;
                ::std::__cxx11::string::~string((string *)local_8c0);
              } while (local_8c0 != &local_5d0);
              ::std::allocator<char>::~allocator
                        ((allocator<char> *)
                         ((long)&parents.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
            }
            else {
              ::std::__cxx11::string::substr
                        ((ulong)((long)&item.field_2 + 8),(ulong)((long)&buffer.field_2 + 8));
              detail::trim_copy(&local_240,(string *)((long)&item.field_2 + 8));
              ::std::__cxx11::string::operator=((string *)local_138,(string *)&local_240);
              ::std::__cxx11::string::~string((string *)&local_240);
              ::std::__cxx11::string::~string((string *)(item.field_2._M_local_buf + 8));
              ::std::__cxx11::string::substr((ulong)local_2a0,(ulong)((long)&buffer.field_2 + 8));
              detail::trim_copy((string *)local_280,(string *)local_2a0);
              ::std::__cxx11::string::~string((string *)local_2a0);
              iVar7 = ::std::__cxx11::string::compare((ulong)local_280,0,(char *)0x3);
              local_795 = true;
              if (iVar7 != 0) {
                iVar7 = ::std::__cxx11::string::compare((ulong)local_280,0,(char *)0x3);
                local_795 = iVar7 == 0;
              }
              citems.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = local_795;
              if ((local_795 == false) && (local_220 != 0xffffffffffffffff)) {
                ::std::__cxx11::string::string((string *)&local_2e0,(string *)local_280);
                detail::split_up((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)local_2c0,&local_2e0,this->commentChar);
                ::std::__cxx11::string::~string((string *)&local_2e0);
                pvVar14 = std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::front((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)local_2c0);
                detail::trim_copy((string *)local_300,pvVar14);
                ::std::__cxx11::string::operator=((string *)local_280,(string *)local_300);
                ::std::__cxx11::string::~string((string *)local_300);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_2c0);
              }
              if ((citems.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
                uVar10 = ::std::__cxx11::string::size();
                if ((uVar10 < 2) ||
                   (pcVar9 = (char *)::std::__cxx11::string::front(), *pcVar9 != local_713)) {
                  if (((bVar19) || (bVar20)) &&
                     (lVar11 = ::std::__cxx11::string::find_first_of
                                         ((char)local_280,
                                          (ulong)(uint)(int)line_sep_chars.field_2._M_local_buf[0xe]
                                         ), lVar11 != -1)) {
                    ::std::__cxx11::string::string((string *)&local_4f0,(string *)local_280);
                    detail::split_up(&local_4d0,&local_4f0,line_sep_chars.field_2._M_local_buf[0xe])
                    ;
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)((long)&name.field_2 + 8),&local_4d0);
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~vector(&local_4d0);
                    ::std::__cxx11::string::~string((string *)&local_4f0);
                  }
                  else if (((bVar19) || (bVar20)) &&
                          (lVar11 = ::std::__cxx11::string::find_first_of((char)local_280,0x20),
                          lVar11 != -1)) {
                    ::std::__cxx11::string::string((string *)&local_528,(string *)local_280);
                    detail::split_up(&local_508,&local_528,'\0');
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)((long)&name.field_2 + 8),&local_508);
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~vector(&local_508);
                    ::std::__cxx11::string::~string((string *)&local_528);
                  }
                  else {
                    local_560 = &local_558;
                    ::std::__cxx11::string::string((string *)local_560,(string *)local_280);
                    local_538 = &local_558;
                    local_530 = 1;
                    __l_00._M_len = 1;
                    __l_00._M_array = local_538;
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)((long)&name.field_2 + 8),__l_00);
                    local_868 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&local_538;
                    do {
                      local_868 = local_868 + -1;
                      ::std::__cxx11::string::~string((string *)local_868);
                    } while (local_868 != &local_558);
                  }
                }
                else {
                  ::std::__cxx11::string::string((string *)local_448);
                  while( true ) {
                    pcVar9 = (char *)::std::__cxx11::string::back();
                    local_841 = false;
                    if (*pcVar9 != line_sep_chars.field_2._M_local_buf[0xf]) {
                      piVar8 = ::std::getline<char,std::char_traits<char>,std::allocator<char>>
                                         (input,(string *)local_448);
                      local_841 = ::std::ios::operator_cast_to_bool
                                            ((ios *)(piVar8 + *(long *)(*(long *)piVar8 + -0x18)));
                    }
                    if (local_841 == false) break;
                    detail::trim((string *)local_448);
                    ::std::__cxx11::string::operator+=((string *)local_280,(string *)local_448);
                  }
                  local_164 = 10;
                  ::std::__cxx11::string::~string((string *)local_448);
                  pcVar9 = (char *)::std::__cxx11::string::back();
                  if (*pcVar9 == line_sep_chars.field_2._M_local_buf[0xf]) {
                    ::std::__cxx11::string::length();
                    ::std::__cxx11::string::substr((ulong)&local_480,(ulong)local_280);
                    detail::split_up(&local_460,&local_480,line_sep_chars.field_2._M_local_buf[0xe])
                    ;
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)((long)&name.field_2 + 8),&local_460);
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~vector(&local_460);
                    ::std::__cxx11::string::~string((string *)&local_480);
                  }
                  else {
                    ::std::__cxx11::string::substr((ulong)&local_4b8,(ulong)local_280);
                    detail::split_up(&local_498,&local_4b8,line_sep_chars.field_2._M_local_buf[0xe])
                    ;
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)((long)&name.field_2 + 8),&local_498);
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~vector(&local_498);
                    ::std::__cxx11::string::~string((string *)&local_4b8);
                  }
                }
              }
              else {
                pcVar9 = (char *)::std::__cxx11::string::front();
                local_301 = *pcVar9;
                ::std::__cxx11::string::substr
                          ((ulong)local_328,(ulong)((long)&currentSection.field_2 + 8));
                ::std::__cxx11::string::operator=((string *)local_280,local_328);
                ::std::__cxx11::string::~string(local_328);
                detail::ltrim((string *)local_280);
                ::std::__cxx11::string::erase((ulong)local_280,0);
                bVar2 = true;
                local_329 = 0;
                local_32a = 1;
                uVar10 = ::std::__cxx11::string::empty();
                if (((uVar10 & 1) == 0) &&
                   (pcVar9 = (char *)::std::__cxx11::string::back(), *pcVar9 == '\\')) {
                  ::std::__cxx11::string::pop_back();
                  local_329 = 1;
                }
                else {
                  bVar3 = detail::hasMLString((string *)local_280,local_301);
                  if (bVar3) {
                    ::std::__cxx11::string::pop_back();
                    ::std::__cxx11::string::pop_back();
                    ::std::__cxx11::string::pop_back();
                    if (local_301 == '\"') {
                      detail::remove_escaped_characters((string *)&iarg,(string *)local_280);
                      ::std::__cxx11::string::operator=((string *)local_280,(string *)&iarg);
                      ::std::__cxx11::string::~string((string *)&iarg);
                    }
                    bVar2 = false;
                  }
                }
                do {
                  if (!bVar2) break;
                  ::std::__cxx11::string::string((string *)local_3a0);
                  piVar8 = ::std::getline<char,std::char_traits<char>,std::allocator<char>>
                                     (input,(string *)local_3a0);
                  bVar6 = ::std::ios::operator!
                                    ((ios *)(piVar8 + *(long *)(*(long *)piVar8 + -0x18)));
                  if ((bVar6 & 1) == 0) {
                    ::std::__cxx11::string::operator=
                              ((string *)(buffer.field_2._M_local_buf + 8),(string *)local_3a0);
                    detail::rtrim((string *)((long)&buffer.field_2 + 8));
                    bVar3 = detail::hasMLString((string *)((long)&buffer.field_2 + 8),local_301);
                    if (bVar3) {
                      ::std::__cxx11::string::pop_back();
                      ::std::__cxx11::string::pop_back();
                      ::std::__cxx11::string::pop_back();
                      if ((local_329 & 1) == 0) {
                        if (((local_32a & 1) == 0) ||
                           (uVar10 = ::std::__cxx11::string::empty(), (uVar10 & 1) == 0)) {
                          ::std::__cxx11::string::push_back((char)local_280);
                        }
                      }
                      else {
                        detail::ltrim((string *)((long)&buffer.field_2 + 8));
                      }
                      local_32a = 0;
                      ::std::__cxx11::string::operator+=
                                ((string *)local_280,(string *)(buffer.field_2._M_local_buf + 8));
                      bVar2 = false;
                      uVar10 = ::std::__cxx11::string::empty();
                      if (((uVar10 & 1) == 0) &&
                         (pcVar9 = (char *)::std::__cxx11::string::back(), *pcVar9 == '\n')) {
                        ::std::__cxx11::string::pop_back();
                      }
                      if (local_301 == '\"') {
                        detail::remove_escaped_characters((string *)&iarg_1,(string *)local_280);
                        ::std::__cxx11::string::operator=((string *)local_280,(string *)&iarg_1);
                        ::std::__cxx11::string::~string((string *)&iarg_1);
                      }
                    }
                    else {
                      if ((local_329 & 1) == 0) {
                        if (((local_32a & 1) == 0) ||
                           (uVar10 = ::std::__cxx11::string::empty(), (uVar10 & 1) == 0)) {
                          ::std::__cxx11::string::push_back((char)local_280);
                        }
                      }
                      else {
                        detail::trim((string *)local_3a0);
                      }
                      local_329 = 0;
                      local_32a = 0;
                      uVar10 = ::std::__cxx11::string::empty();
                      if (((uVar10 & 1) == 0) &&
                         (pcVar9 = (char *)::std::__cxx11::string::back(), *pcVar9 == '\\')) {
                        local_329 = 1;
                        ::std::__cxx11::string::pop_back();
                      }
                      ::std::__cxx11::string::operator+=((string *)local_280,(string *)local_3a0);
                    }
                    local_164 = 0;
                  }
                  else {
                    local_164 = 9;
                  }
                  ::std::__cxx11::string::~string((string *)local_3a0);
                } while (local_164 == 0);
                multiline.field_2._8_8_ = &local_420;
                ::std::__cxx11::string::string
                          ((string *)multiline.field_2._8_8_,(string *)local_280);
                local_400 = &local_420;
                local_3f8 = 1;
                __l_01._M_len = 1;
                __l_01._M_array = local_400;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)((long)&name.field_2 + 8),__l_01);
                local_808 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &local_400;
                do {
                  local_808 = local_808 + -1;
                  ::std::__cxx11::string::~string((string *)local_808);
                } while (local_808 != &local_420);
              }
              ::std::__cxx11::string::~string((string *)local_280);
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_5f8);
            detail::generate_parents
                      ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&__range3,(string *)local_80,(string *)local_138,this->parentSeparatorChar
                      );
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_5f8,
                        (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&__range3);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&__range3);
            detail::process_quoted_string((string *)local_138,'\"','\'');
            pvVar1 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)((long)&name.field_2 + 8);
            __end3 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::begin(pvVar1);
            it = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end(pvVar1);
            while (bVar2 = __gnu_cxx::operator!=
                                     (&__end3,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                               *)&it), bVar2) {
              ia = (invalid_argument *)
                   __gnu_cxx::
                   __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&__end3);
              detail::process_quoted_string((string *)ia,this->stringQuote,this->literalQuote);
              __gnu_cxx::
              __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator++(&__end3);
            }
            sVar18 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_5f8);
            if (this->maximumLayers < sVar18) {
              local_164 = 2;
            }
            else {
              uVar10 = ::std::__cxx11::string::empty();
              if (((uVar10 & 1) != 0) || (bVar4)) {
LAB_00110814:
                local_680._M_current =
                     (ConfigItem *)
                     detail::find_matching_config
                               (__return_storage_ptr__,
                                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_5f8,(string *)local_138,
                                (bool)(this->allowMultipleDuplicateFields & 1));
                local_688._M_current =
                     (ConfigItem *)
                     std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::end
                               (__return_storage_ptr__);
                bVar2 = __gnu_cxx::operator!=(&local_680,&local_688);
                if (bVar2) {
                  pCVar15 = __gnu_cxx::
                            __normal_iterator<CLI::ConfigItem_*,_std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>_>
                            ::operator->(&local_680);
                  sVar18 = std::
                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::size(&pCVar15->inputs);
                  if (((1 < sVar18) &&
                      (sVar18 = std::
                                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        *)((long)&name.field_2 + 8)), 1 < sVar18)) ||
                     ((this->allowMultipleDuplicateFields & 1U) != 0)) {
                    pCVar15 = __gnu_cxx::
                              __normal_iterator<CLI::ConfigItem_*,_std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>_>
                              ::operator->(&local_680);
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::back(&pCVar15->inputs);
                    uVar10 = ::std::__cxx11::string::empty();
                    if ((uVar10 & 1) == 0) {
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::front((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)((long)&name.field_2 + 8));
                      uVar10 = ::std::__cxx11::string::empty();
                      if ((uVar10 & 1) == 0) {
                        pCVar15 = __gnu_cxx::
                                  __normal_iterator<CLI::ConfigItem_*,_std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>_>
                                  ::operator->(&local_680);
                        pvVar14 = std::
                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ::back(&pCVar15->inputs);
                        bVar2 = ::std::operator==(pvVar14,"%%");
                        if (!bVar2) {
                          pvVar14 = std::
                                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ::front((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             *)((long)&name.field_2 + 8));
                          bVar2 = ::std::operator==(pvVar14,"%%");
                          if (!bVar2) {
                            pCVar15 = __gnu_cxx::
                                      __normal_iterator<CLI::ConfigItem_*,_std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>_>
                                      ::operator->(&local_680);
                            ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                            ::emplace_back<char_const(&)[3]>
                                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                        *)&pCVar15->inputs,(char (*) [3])"%%");
                            pCVar15 = __gnu_cxx::
                                      __normal_iterator<CLI::ConfigItem_*,_std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>_>
                                      ::operator->(&local_680);
                            pCVar15->multiline = true;
                          }
                        }
                      }
                    }
                  }
                  pCVar15 = __gnu_cxx::
                            __normal_iterator<CLI::ConfigItem_*,_std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>_>
                            ::operator->(&local_680);
                  pCVar16 = __gnu_cxx::
                            __normal_iterator<CLI::ConfigItem_*,_std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>_>
                            ::operator->(&local_680);
                  local_698._M_current =
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::end(&pCVar16->inputs);
                  __gnu_cxx::
                  __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  ::__normal_iterator<std::__cxx11::string*>
                            ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                              *)&local_690,&local_698);
                  pvVar1 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)((long)&name.field_2 + 8);
                  __first = std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::begin(pvVar1);
                  __last = std::
                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::end(pvVar1);
                  ename.field_2._8_8_ =
                       ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                       insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                                 ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                   *)&pCVar15->inputs,local_690,
                                  (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   )__first._M_current,
                                  (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   )__last._M_current);
                }
                else {
                  std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::emplace_back<>
                            (__return_storage_ptr__);
                  pvVar17 = std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::back
                                      (__return_storage_ptr__);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator=(&pvVar17->parents,
                              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_5f8);
                  pvVar17 = std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::back
                                      (__return_storage_ptr__);
                  ::std::__cxx11::string::operator=((string *)&pvVar17->name,(string *)local_138);
                  pvVar17 = std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::back
                                      (__return_storage_ptr__);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator=(&pvVar17->inputs,
                              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)((long)&name.field_2 + 8));
                }
                local_164 = 0;
              }
              else {
                bVar2 = std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_5f8);
                if (!bVar2) {
                  pvVar14 = std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::front((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)local_5f8);
                  bVar2 = ::std::operator!=(pvVar14,&this->configSection);
                  if (!bVar2) {
                    if ((-1 < this->configIndex) &&
                       (line_sep_chars.field_2._8_4_ != (int)this->configIndex)) {
                      local_164 = 2;
                      goto LAB_00110acc;
                    }
                    local_670._M_current =
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)local_5f8);
                    __gnu_cxx::
                    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    ::__normal_iterator<std::__cxx11::string*>
                              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                                *)&local_668,&local_670);
                    match._M_current =
                         (ConfigItem *)
                         std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)local_5f8,local_668);
                    bVar4 = true;
                    goto LAB_00110814;
                  }
                }
                local_164 = 2;
              }
            }
LAB_00110acc:
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_5f8);
          }
        }
      }
    }
    ::std::__cxx11::string::~string((string *)local_138);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&name.field_2 + 8));
  } while( true );
}

Assistant:

inline std::vector<ConfigItem> ConfigBase::from_config(std::istream &input) const {
    std::string line;
    std::string buffer;
    std::string currentSection = "default";
    std::string previousSection = "default";
    std::vector<ConfigItem> output;
    bool isDefaultArray = (arrayStart == '[' && arrayEnd == ']' && arraySeparator == ',');
    bool isINIArray = (arrayStart == '\0' || arrayStart == ' ') && arrayStart == arrayEnd;
    bool inSection{false};
    bool inMLineComment{false};
    bool inMLineValue{false};

    char aStart = (isINIArray) ? '[' : arrayStart;
    char aEnd = (isINIArray) ? ']' : arrayEnd;
    char aSep = (isINIArray && arraySeparator == ' ') ? ',' : arraySeparator;
    int currentSectionIndex{0};

    std::string line_sep_chars{parentSeparatorChar, commentChar, valueDelimiter};
    while(getline(input, buffer)) {
        std::vector<std::string> items_buffer;
        std::string name;
        line = detail::trim_copy(buffer);
        std::size_t len = line.length();
        // lines have to be at least 3 characters to have any meaning to CLI just skip the rest
        if(len < 3) {
            continue;
        }
        if(line.compare(0, 3, multiline_string_quote) == 0 || line.compare(0, 3, multiline_literal_quote) == 0) {
            inMLineComment = true;
            auto cchar = line.front();
            while(inMLineComment) {
                if(getline(input, line)) {
                    detail::trim(line);
                } else {
                    break;
                }
                if(detail::hasMLString(line, cchar)) {
                    inMLineComment = false;
                }
            }
            continue;
        }
        if(line.front() == '[' && line.back() == ']') {
            if(currentSection != "default") {
                // insert a section end which is just an empty items_buffer
                output.emplace_back();
                output.back().parents = detail::generate_parents(currentSection, name, parentSeparatorChar);
                output.back().name = "--";
            }
            currentSection = line.substr(1, len - 2);
            // deal with double brackets for TOML
            if(currentSection.size() > 1 && currentSection.front() == '[' && currentSection.back() == ']') {
                currentSection = currentSection.substr(1, currentSection.size() - 2);
            }
            if(detail::to_lower(currentSection) == "default") {
                currentSection = "default";
            } else {
                detail::checkParentSegments(output, currentSection, parentSeparatorChar);
            }
            inSection = false;
            if(currentSection == previousSection) {
                ++currentSectionIndex;
            } else {
                currentSectionIndex = 0;
                previousSection = currentSection;
            }
            continue;
        }

        // comment lines
        if(line.front() == ';' || line.front() == '#' || line.front() == commentChar) {
            continue;
        }
        std::size_t search_start = 0;
        if(line.find_first_of("\"'`") != std::string::npos) {
            while(search_start < line.size()) {
                auto test_char = line[search_start];
                if(test_char == '\"' || test_char == '\'' || test_char == '`') {
                    search_start = detail::close_sequence(line, search_start, line[search_start]);
                    ++search_start;
                } else if(test_char == valueDelimiter || test_char == commentChar) {
                    --search_start;
                    break;
                } else if(test_char == ' ' || test_char == '\t' || test_char == parentSeparatorChar) {
                    ++search_start;
                } else {
                    search_start = line.find_first_of(line_sep_chars, search_start);
                }
            }
        }
        // Find = in string, split and recombine
        auto delimiter_pos = line.find_first_of(valueDelimiter, search_start + 1);
        auto comment_pos = line.find_first_of(commentChar, search_start);
        if(comment_pos < delimiter_pos) {
            delimiter_pos = std::string::npos;
        }
        if(delimiter_pos != std::string::npos) {

            name = detail::trim_copy(line.substr(0, delimiter_pos));
            std::string item = detail::trim_copy(line.substr(delimiter_pos + 1, std::string::npos));
            bool mlquote =
                (item.compare(0, 3, multiline_literal_quote) == 0 || item.compare(0, 3, multiline_string_quote) == 0);
            if(!mlquote && comment_pos != std::string::npos) {
                auto citems = detail::split_up(item, commentChar);
                item = detail::trim_copy(citems.front());
            }
            if(mlquote) {
                // multiline string
                auto keyChar = item.front();
                item = buffer.substr(delimiter_pos + 1, std::string::npos);
                detail::ltrim(item);
                item.erase(0, 3);
                inMLineValue = true;
                bool lineExtension{false};
                bool firstLine = true;
                if(!item.empty() && item.back() == '\\') {
                    item.pop_back();
                    lineExtension = true;
                } else if(detail::hasMLString(item, keyChar)) {
                    // deal with the first line closing the multiline literal
                    item.pop_back();
                    item.pop_back();
                    item.pop_back();
                    if(keyChar == '\"') {
                        try {
                            item = detail::remove_escaped_characters(item);
                        } catch(const std::invalid_argument &iarg) {
                            throw CLI::ParseError(iarg.what(), CLI::ExitCodes::InvalidError);
                        }
                    }
                    inMLineValue = false;
                }
                while(inMLineValue) {
                    std::string l2;
                    if(!std::getline(input, l2)) {
                        break;
                    }
                    line = l2;
                    detail::rtrim(line);
                    if(detail::hasMLString(line, keyChar)) {
                        line.pop_back();
                        line.pop_back();
                        line.pop_back();
                        if(lineExtension) {
                            detail::ltrim(line);
                        } else if(!(firstLine && item.empty())) {
                            item.push_back('\n');
                        }
                        firstLine = false;
                        item += line;
                        inMLineValue = false;
                        if(!item.empty() && item.back() == '\n') {
                            item.pop_back();
                        }
                        if(keyChar == '\"') {
                            try {
                                item = detail::remove_escaped_characters(item);
                            } catch(const std::invalid_argument &iarg) {
                                throw CLI::ParseError(iarg.what(), CLI::ExitCodes::InvalidError);
                            }
                        }
                    } else {
                        if(lineExtension) {
                            detail::trim(l2);
                        } else if(!(firstLine && item.empty())) {
                            item.push_back('\n');
                        }
                        lineExtension = false;
                        firstLine = false;
                        if(!l2.empty() && l2.back() == '\\') {
                            lineExtension = true;
                            l2.pop_back();
                        }
                        item += l2;
                    }
                }
                items_buffer = {item};
            } else if(item.size() > 1 && item.front() == aStart) {
                for(std::string multiline; item.back() != aEnd && std::getline(input, multiline);) {
                    detail::trim(multiline);
                    item += multiline;
                }
                if(item.back() == aEnd) {
                    items_buffer = detail::split_up(item.substr(1, item.length() - 2), aSep);
                } else {
                    items_buffer = detail::split_up(item.substr(1, std::string::npos), aSep);
                }
            } else if((isDefaultArray || isINIArray) && item.find_first_of(aSep) != std::string::npos) {
                items_buffer = detail::split_up(item, aSep);
            } else if((isDefaultArray || isINIArray) && item.find_first_of(' ') != std::string::npos) {
                items_buffer = detail::split_up(item, '\0');
            } else {
                items_buffer = {item};
            }
        } else {
            name = detail::trim_copy(line.substr(0, comment_pos));
            items_buffer = {"true"};
        }
        std::vector<std::string> parents;
        try {
            parents = detail::generate_parents(currentSection, name, parentSeparatorChar);
            detail::process_quoted_string(name);
            // clean up quotes on the items and check for escaped strings
            for(auto &it : items_buffer) {
                detail::process_quoted_string(it, stringQuote, literalQuote);
            }
        } catch(const std::invalid_argument &ia) {
            throw CLI::ParseError(ia.what(), CLI::ExitCodes::InvalidError);
        }

        if(parents.size() > maximumLayers) {
            continue;
        }
        if(!configSection.empty() && !inSection) {
            if(parents.empty() || parents.front() != configSection) {
                continue;
            }
            if(configIndex >= 0 && currentSectionIndex != configIndex) {
                continue;
            }
            parents.erase(parents.begin());
            inSection = true;
        }
        auto match = detail::find_matching_config(output, parents, name, allowMultipleDuplicateFields);
        if(match != output.end()) {
            if((match->inputs.size() > 1 && items_buffer.size() > 1) || allowMultipleDuplicateFields) {
                // insert a separator if one is not already present
                if(!(match->inputs.back().empty() || items_buffer.front().empty() || match->inputs.back() == "%%" ||
                     items_buffer.front() == "%%")) {
                    match->inputs.emplace_back("%%");
                    match->multiline = true;
                }
            }
            match->inputs.insert(match->inputs.end(), items_buffer.begin(), items_buffer.end());
        } else {
            output.emplace_back();
            output.back().parents = std::move(parents);
            output.back().name = std::move(name);
            output.back().inputs = std::move(items_buffer);
        }
    }
    if(currentSection != "default") {
        // insert a section end which is just an empty items_buffer
        std::string ename;
        output.emplace_back();
        output.back().parents = detail::generate_parents(currentSection, ename, parentSeparatorChar);
        output.back().name = "--";
        while(output.back().parents.size() > 1) {
            output.push_back(output.back());
            output.back().parents.pop_back();
        }
    }
    return output;
}